

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O2

void __thiscall CSocekt::tmpoutMsgRecvQueue(CSocekt *this)

{
  list<char_*,_std::allocator<char_*>_> *this_00;
  _List_node_base *point;
  CMemory *this_01;
  int iVar1;
  bool bVar2;
  
  this_00 = &this->m_MsgRecvQueue;
  if (((this->m_MsgRecvQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl._M_node.
       super__List_node_base._M_next != (_List_node_base *)this_00) &&
     (iVar1 = (int)(this->m_MsgRecvQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl.
                   _M_node._M_size, 999 < iVar1)) {
    this_01 = CMemory::GetInstance();
    iVar1 = iVar1 + -500;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      point = (this_00->super__List_base<char_*,_std::allocator<char_*>_>)._M_impl._M_node.
              super__List_node_base._M_next[1]._M_next;
      std::__cxx11::list<char_*,_std::allocator<char_*>_>::pop_front(this_00);
      CMemory::FreeMemory(this_01,point);
    }
  }
  return;
}

Assistant:

void CSocekt::tmpoutMsgRecvQueue()
{
    //日后可能引入outMsgRecvQueue()，这个函数可能需要临界......
    if(m_MsgRecvQueue.empty())  //没有消息直接退出
    {
        return;
    }
    int size = m_MsgRecvQueue.size();
    if(size < 1000) //消息不超过1000条就不处理先
    {
        return;
    }
    //消息达到1000条
    CMemory *p_memory = CMemory::GetInstance();
    int cha = size - 500;
    for(int i = 0; i < cha; ++i)
    {
        //一次干掉一堆
        char *sTmpMsgBuf = m_MsgRecvQueue.front();//返回第一个元素但不检查元素存在与否
        m_MsgRecvQueue.pop_front();               //移除第一个元素但不返回
        p_memory->FreeMemory(sTmpMsgBuf);         //先释放掉把；
    }
    return;
}